

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall pybind11::error_already_set::~error_already_set(error_already_set *this)

{
  gil_scoped_acquire gil;
  gil_scoped_acquire gStack_18;
  
  *(undefined ***)this = &PTR__error_already_set_00163838;
  if (this->value != (PyObject *)0x0) {
    gil_scoped_acquire::gil_scoped_acquire(&gStack_18);
    clear(this);
    gil_scoped_acquire::~gil_scoped_acquire(&gStack_18);
  }
  std::runtime_error::~runtime_error(&this->super_runtime_error);
  return;
}

Assistant:

error_already_set::~error_already_set() {
    if (value) {
        gil_scoped_acquire gil;
        clear();
    }
}